

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitterBeam.h
# Opt level: O2

void __thiscall KDIS::DATA_TYPE::EmitterBeam::EmitterBeam(EmitterBeam *this,EmitterBeam *param_1)

{
  KUINT8 KVar1;
  KUINT16 KVar2;
  KFLOAT32 KVar3;
  KFLOAT32 KVar4;
  KFLOAT32 KVar5;
  KFLOAT32 KVar6;
  KFLOAT32 KVar7;
  KFLOAT32 KVar8;
  KFLOAT32 KVar9;
  KUINT8 KVar10;
  KUINT8 KVar11;
  
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__EmitterBeam_00324550;
  KVar1 = param_1->m_ui8EmitterBeamIDNumber;
  KVar2 = param_1->m_ui16BeamParamIndex;
  this->m_ui8BeamDataLength = param_1->m_ui8BeamDataLength;
  this->m_ui8EmitterBeamIDNumber = KVar1;
  this->m_ui16BeamParamIndex = KVar2;
  (this->m_FundamentalParameterData).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00324908;
  KVar3 = (param_1->m_FundamentalParameterData).m_f32FreqRange;
  KVar4 = (param_1->m_FundamentalParameterData).m_f32EffectiveRadiatedPower;
  KVar5 = (param_1->m_FundamentalParameterData).m_f32PulseRepetitionFreq;
  KVar6 = (param_1->m_FundamentalParameterData).m_f32PulseWidth;
  KVar7 = (param_1->m_FundamentalParameterData).m_f32BeamAzimuthCenter;
  KVar8 = (param_1->m_FundamentalParameterData).m_f32BeamAzimuthSweep;
  KVar9 = (param_1->m_FundamentalParameterData).m_f32BeamElevationCenter;
  (this->m_FundamentalParameterData).m_f32Freq = (param_1->m_FundamentalParameterData).m_f32Freq;
  (this->m_FundamentalParameterData).m_f32FreqRange = KVar3;
  (this->m_FundamentalParameterData).m_f32EffectiveRadiatedPower = KVar4;
  (this->m_FundamentalParameterData).m_f32PulseRepetitionFreq = KVar5;
  (this->m_FundamentalParameterData).m_f32PulseWidth = KVar6;
  (this->m_FundamentalParameterData).m_f32BeamAzimuthCenter = KVar7;
  (this->m_FundamentalParameterData).m_f32BeamAzimuthSweep = KVar8;
  (this->m_FundamentalParameterData).m_f32BeamElevationCenter = KVar9;
  KVar3 = (param_1->m_FundamentalParameterData).m_f32BeamSweepSync;
  (this->m_FundamentalParameterData).m_f32BeamElevationSweep =
       (param_1->m_FundamentalParameterData).m_f32BeamElevationSweep;
  (this->m_FundamentalParameterData).m_f32BeamSweepSync = KVar3;
  KVar1 = param_1->m_ui8NumTargetInTrackJamField;
  this->m_ui8BeamFunction = param_1->m_ui8BeamFunction;
  this->m_ui8NumTargetInTrackJamField = KVar1;
  this->m_ui8HighDensityTrackJam = param_1->m_ui8HighDensityTrackJam;
  (this->m_BeamStatus).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__BeamStatus_00326ee8;
  (this->m_BeamStatus).m_ui8BeamStatus = (param_1->m_BeamStatus).m_ui8BeamStatus;
  (this->m_JammingTechnique).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__JammingTechnique_00327268;
  KVar1 = (param_1->m_JammingTechnique).m_ui8Category;
  KVar10 = (param_1->m_JammingTechnique).m_ui8Subcategory;
  KVar11 = (param_1->m_JammingTechnique).m_ui8Specific;
  (this->m_JammingTechnique).m_ui8Kind = (param_1->m_JammingTechnique).m_ui8Kind;
  (this->m_JammingTechnique).m_ui8Category = KVar1;
  (this->m_JammingTechnique).m_ui8Subcategory = KVar10;
  (this->m_JammingTechnique).m_ui8Specific = KVar11;
  std::
  vector<KDIS::DATA_TYPE::TrackJamTargetIdentifier,_std::allocator<KDIS::DATA_TYPE::TrackJamTargetIdentifier>_>
  ::vector(&this->m_vTrackJamTargets,&param_1->m_vTrackJamTargets);
  return;
}

Assistant:

class KDIS_EXPORT EmitterBeam : public DataTypeBase
{
protected:

    KUINT8 m_ui8BeamDataLength;

    KUINT8 m_ui8EmitterBeamIDNumber;

    KUINT16 m_ui16BeamParamIndex;

    FundamentalParameterData m_FundamentalParameterData;

    KUINT8 m_ui8BeamFunction;

    KUINT8 m_ui8NumTargetInTrackJamField;

    KUINT8 m_ui8HighDensityTrackJam;

#if DIS_VERSION < 7

    KUINT8 m_ui8Padding;

    KUINT32 m_ui32JammingModeSequence;

#elif DIS_VERSION > 6

    BeamStatus m_BeamStatus;

    JammingTechnique m_JammingTechnique;

#endif

    vector<TrackJamTargetIdentifier> m_vTrackJamTargets;

public:

    static const KUINT16 EMITTER_BEAM_SIZE = 52; // Min Size

    EmitterBeam();

        EmitterBeam(KDataStream &stream) noexcept(false);

    EmitterBeam( KUINT8 BeamID, KUINT16 BeamParamIndex, const FundamentalParameterData & FPD,
                 EmitterFunction EBF, HighDensityTrackJam HDTJ,
#if DIS_VERSION < 7
                 KUINT32 JammingModeSequence );
#elif DIS_VERSION > 6
                 const BeamStatus & BS, const JammingTechnique & JT );
#endif

        ~EmitterBeam() override;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EmitterBeam::GetSystemDataLength
    // Description: Length of the emission system in 32 bit words.
    //              E.G 1 = 32 bits / 4 octets. Calculated automatically.
    //************************************
    KUINT8 GetBeamDataLength() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EmitterBeam::SetEmitterBeamIDNumber
    //              KDIS::DATA_TYPE::EmitterBeam::GetEmitterBeamIDNumber
    // Description: Unique ID for emitter beam, Once established for an exercise
    //              no other beam may use this ID.
    // Parameter:   KUINT8 ID, void
    //************************************
    void SetEmitterBeamIDNumber( KUINT8 ID );
    KUINT8 GetEmitterBeamIDNumber() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EmitterBeam::SetBeamParamIndex
    //              KDIS::DATA_TYPE::EmitterBeam::GetBeamParamIndex
    // Description: Number used by receiving entities in conjunction with the
    //              emitter name field to provide a pointer to the stored
    //              database parameter required to regenerate the beam.
    // Parameter:   KUINT16 BPI, void
    //************************************
    void SetBeamParamIndex( KUINT16 BPI );
    KUINT16 GetBeamParamIndex() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EmitterBeam::SetFundamentalParameterData
    //              KDIS::DATA_TYPE::EmitterBeam::GetFundamentalParameterData
    // Description: Specifies dynamic parameters of the emitter.
    // Parameter:   const FundamentalParameterData & FPD, void
    //************************************
    void SetFundamentalParameterData( const FundamentalParameterData & FPD );
    const FundamentalParameterData & GetFundamentalParameterData() const;
    FundamentalParameterData & GetFundamentalParameterData();

    //************************************
    // FullName:    KDIS::DATA_TYPE::EmitterBeam::SetEmitterBeamFunction
    //              KDIS::DATA_TYPE::EmitterBeam::GetEmitterBeamFunction
    // Description: Specifies the function of a Emitter Beam
    // Parameter:   const EmitterFunction & FPD, void
    //************************************
    void SetEmitterBeamFunction( EmitterFunction EBF );
    EmitterFunction GetEmitterBeamFunction() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EmitterBeam::GetNumTargetInTrackJamField
    // Description: Number of targets being tracked/jammed
    //************************************
    KUINT8 GetNumTargetInTrackJamField() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EmitterBeam::SetHighDensityTrackJam
    //              KDIS::DATA_TYPE::EmitterBeam::GetHighDensityTrackJam
    // Description: Indicates if the receiving simulation application can assume that all
    //              targets, in the scan pattern which the sending emitter can track or
    //              jam are being tracked/jammed/ When selected the system issuing the
    //              PDU shall not include any entities in the track/jam field.
    // Parameter:   const HighDensityTrackJam & HDTJ, void
    //************************************
    void SetHighDensityTrackJam( HighDensityTrackJam HDTJ );
    HighDensityTrackJam GetHighDensityTrackJam() const;

#if DIS_VERSION < 7

    //************************************
    // FullName:    KDIS::DATA_TYPE::EmitterBeam::SetJammingModeSequence
    //              KDIS::DATA_TYPE::EmitterBeam::GetJammingModeSequence
    // Description: Used to identify one or more multiple jamming techniques
    //              being applied.
    // Parameter:   KUINT32 JMS, void
    //************************************
    void SetJammingModeSequence( KUINT32 JMS );
    KUINT32 GetJammingModeSequence() const;

#elif DIS_VERSION > 6

    //************************************
    // FullName:    KDIS::DATA_TYPE::EmitterBeam::SetBeamStatus
    //              KDIS::DATA_TYPE::EmitterBeam::GetBeamStatus
    // Description: Beam State information.
    // Parameter:   BeamStatus BS, void
    //************************************
    void SetBeamStatus(const BeamStatus &BS );
    BeamStatus GetBeamStatus() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EmitterBeam::SetJammingTechnique
    //              KDIS::DATA_TYPE::EmitterBeam::GetJammingTechnique
    // Description: Jamming Technique.
    // Parameter:   JammingTechnique JT, void
    //************************************
    void SetJammingTechnique( JammingTechnique JT );
    JammingTechnique GetJammingTechnique() const;

#endif

    //************************************
    // FullName:    KDIS::DATA_TYPE::EmitterBeam::AddTrackedJammedTarget
    //              KDIS::DATA_TYPE::EmitterBeam::SetTrackedJammedTargets
    //              KDIS::DATA_TYPE::EmitterBeam::GetTrackedJammedTargets
    //              KDIS::DATA_TYPE::EmitterBeam::ClearTrackedJammedTargets
    // Description: Tacked jammed targets.
    // Parameter:   const TrackJamTargetIdentifier & ID, const vector<TrackJamTargetIdentifier> & ID
    //************************************
    void AddTrackedJammedTarget( const TrackJamTargetIdentifier & ID );
    void SetTrackedJammedTargets( const vector<TrackJamTargetIdentifier> & ID );
    const vector<TrackJamTargetIdentifier> & GetTrackedJammedTargets() const;
    void ClearTrackedJammedTargets();

    //************************************
    // FullName:    KDIS::DATA_TYPE::EmitterBeam::GetAsString
    // Description: Returns a string representation
    //************************************
    KString GetAsString() const override;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EmitterBeam::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    void Decode(KDataStream &stream) noexcept(false) override;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EmitterBeam::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    KDataStream Encode() const override;
    void Encode( KDataStream & stream ) const override;

    KBOOL operator == ( const EmitterBeam & Value ) const;
    KBOOL operator != ( const EmitterBeam & Value ) const;
}